

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O2

Movement StrToMovement(string *move)

{
  uint uVar1;
  uint uVar2;
  undefined4 extraout_EDX;
  Movement MVar3;
  string s;
  allocator local_79;
  string local_78 [32];
  string local_58;
  string local_38;
  
  std::__cxx11::string::string(local_78,"",&local_79);
  std::__cxx11::string::push_back((char)local_78);
  std::__cxx11::string::push_back((char)local_78);
  std::__cxx11::string::string((string *)&local_38,local_78);
  uVar1 = StrToInt(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::assign((char *)local_78);
  std::__cxx11::string::push_back((char)local_78);
  std::__cxx11::string::push_back((char)local_78);
  std::__cxx11::string::string((string *)&local_58,local_78);
  uVar2 = StrToInt(&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_78);
  MVar3._0_4_ = uVar1 & 0xff | (uVar2 & 0xff) << 8;
  MVar3.value = 0;
  MVar3.catc = (char)extraout_EDX;
  MVar3.movec = (char)((uint)extraout_EDX >> 8);
  MVar3._10_2_ = (short)((uint)extraout_EDX >> 0x10);
  return MVar3;
}

Assistant:

Movement  StrToMovement(const std::string move) {
	std::string s = "";
	s += move[0]; 
    s += move[1];
	int from = StrToInt (s);
	s = ""; 
    s += move[2]; 
    s += move[3];
	int to = StrToInt (s);
    Movement movement;
    movement.from = from;
    movement.to = to;
    movement.capture = 0;
	return movement;
}